

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prs.c
# Opt level: O3

prpnum prsrqpr(prscxdef *ctx)

{
  prpnum pVar1;
  tokcxdef *ptVar2;
  uchar uVar3;
  
  ptVar2 = ctx->prscxtok;
  if ((ptVar2->tokcxcur).toktyp != 0x38) {
    errsigf(ctx->prscxerr,"TADS",0x12d);
  }
  uVar3 = (ptVar2->tokcxcur).toksym.tokstyp;
  if (uVar3 == '\0') {
    prsdef(ctx,&ptVar2->tokcxcur,3);
    uVar3 = (ptVar2->tokcxcur).toksym.tokstyp;
  }
  if (uVar3 == '\x03') {
    pVar1 = (ptVar2->tokcxcur).toksym.toksval;
    toknext(ctx->prscxtok);
    return pVar1;
  }
  errsigf(ctx->prscxerr,"TADS",0x12e);
}

Assistant:

prpnum prsrqpr(prscxdef *ctx)
{
    tokdef *tok = &ctx->prscxtok->tokcxcur;
    prpnum  ret;
        
    /* make sure we get a symbol */
    if (tok->toktyp != TOKTSYMBOL)
        errsig(ctx->prscxerr, ERR_REQSYM);
    
    /* if it's an undefined symbol, make it a property id */
    if (tok->toksym.tokstyp == TOKSTUNK)
        prsdef(ctx, tok, TOKSTPROP);
    
    /* make sure we have a property */
    if (tok->toksym.tokstyp != TOKSTPROP)
        errsig(ctx->prscxerr, ERR_REQPRP);
    
    ret = tok->toksym.toksval;
    toknext(ctx->prscxtok);
    return(ret);
}